

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdialog.cpp
# Opt level: O3

int __thiscall QDialog::exec(QDialog *this)

{
  QDialogPrivate *this_00;
  Data *pDVar1;
  bool bVar2;
  bool on;
  int *piVar3;
  QPlatformDialogHelper *pQVar4;
  Data *pDVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QDialogPrivate **)&(this->super_QWidget).field_0x8;
  pDVar1 = (this_00->eventLoop).wp.d;
  if (((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) ||
     ((this_00->eventLoop).wp.value == (QObject *)0x0)) {
    bVar2 = QWidget::testAttribute_helper(&this->super_QWidget,WA_DeleteOnClose);
    QWidget::setAttribute(&this->super_QWidget,WA_DeleteOnClose,false);
    QDialogPrivate::resetModalitySetByOpen(this_00);
    on = QWidget::testAttribute_helper(&this->super_QWidget,WA_ShowModal);
    QWidget::setAttribute(&this->super_QWidget,WA_ShowModal,true);
    *(undefined4 *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2ac) = 0;
    QWidget::show(&this->super_QWidget);
    piVar3 = (int *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)this);
    if (this_00->nativeDialogInUse == true) {
      pQVar4 = QDialogPrivate::platformHelper(this_00);
      (**(code **)(*(long *)pQVar4 + 0x68))(pQVar4);
    }
    else {
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      QEventLoop::QEventLoop((QEventLoop *)&local_48,(QObject *)0x0);
      pDVar5 = (Data *)QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)&local_48);
      pDVar1 = (this_00->eventLoop).wp.d;
      (this_00->eventLoop).wp.d = pDVar5;
      (this_00->eventLoop).wp.value = (QObject *)&local_48;
      if (pDVar1 != (Data *)0x0) {
        LOCK();
        *(int *)pDVar1 = *(int *)pDVar1 + -1;
        UNLOCK();
        if (*(int *)pDVar1 == 0) {
          operator_delete(pDVar1);
        }
      }
      QEventLoop::exec(&local_48,0x40);
      QEventLoop::~QEventLoop((QEventLoop *)&local_48);
    }
    if (piVar3 == (int *)0x0) {
      iVar6 = 0;
    }
    else {
      if (piVar3[1] == 0) {
        iVar6 = 0;
      }
      else {
        pDVar1 = (this_00->eventLoop).wp.d;
        (this_00->eventLoop).wp.d = (Data *)0x0;
        (this_00->eventLoop).wp.value = (QObject *)0x0;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          *(int *)pDVar1 = *(int *)pDVar1 + -1;
          UNLOCK();
          if (*(int *)pDVar1 == 0) {
            operator_delete(pDVar1);
          }
        }
        QWidget::setAttribute(&this->super_QWidget,WA_ShowModal,on);
        iVar6 = *(int *)(*(long *)&(this->super_QWidget).field_0x8 + 0x2ac);
        if (this_00->nativeDialogInUse == true) {
          pQVar4 = QDialogPrivate::platformHelper(this_00);
          (**(code **)(*(long *)&this_00->super_QWidgetPrivate + 200))(this_00,iVar6,pQVar4);
        }
        if (bVar2) {
          (**(code **)(*(long *)&this->super_QWidget + 0x20))(this);
        }
      }
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
  }
  else {
    exec();
    iVar6 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar6;
  }
  __stack_chk_fail();
}

Assistant:

int QDialog::exec()
{
    Q_D(QDialog);

    if (Q_UNLIKELY(d->eventLoop)) {
        qWarning("QDialog::exec: Recursive call detected");
        return -1;
    }

    bool deleteOnClose = testAttribute(Qt::WA_DeleteOnClose);
    setAttribute(Qt::WA_DeleteOnClose, false);

    d->resetModalitySetByOpen();

    bool wasShowModal = testAttribute(Qt::WA_ShowModal);
    setAttribute(Qt::WA_ShowModal, true);
    setResult(0);

    show();

    QPointer<QDialog> guard = this;
    if (d->nativeDialogInUse) {
        d->platformHelper()->exec();
    } else {
        QEventLoop eventLoop;
        d->eventLoop = &eventLoop;
        (void) eventLoop.exec(QEventLoop::DialogExec);
    }
    if (guard.isNull())
        return QDialog::Rejected;
    d->eventLoop = nullptr;

    setAttribute(Qt::WA_ShowModal, wasShowModal);

    int res = result();
    if (d->nativeDialogInUse)
        d->helperDone(static_cast<QDialog::DialogCode>(res), d->platformHelper());
    if (deleteOnClose)
        delete this;
    return res;
}